

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O3

void __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::flush_output
          (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3> *this)

{
  int in_ESI;
  
  flush_output((ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3> *)
               &this[-1].ram_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,in_ESI);
  return;
}

Assistant:

void flush_output(int) {
			// Flush the video before the audio queue; in a Mac the
			// video is responsible for providing part of the
			// audio signal, so the two aren't as distinct as in
			// most machines.
			update_video();

			// As above: flush audio after video.
			via_.flush();
			audio_.queue.perform();

			// This avoids deferring IWM costs indefinitely, until
			// they become artbitrarily large.
			iwm_.flush();
		}